

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

int xmlSchemaCheckTypeDefCircularInternal
              (xmlSchemaParserCtxtPtr pctxt,xmlSchemaTypePtr ctxtType,xmlSchemaTypePtr ancestor)

{
  xmlNodePtr itemElem;
  int ret;
  xmlSchemaTypePtr ancestor_local;
  xmlSchemaTypePtr ctxtType_local;
  xmlSchemaParserCtxtPtr pctxt_local;
  
  if ((ancestor == (xmlSchemaTypePtr)0x0) || (ancestor->type == XML_SCHEMA_TYPE_BASIC)) {
    pctxt_local._4_4_ = 0;
  }
  else if (ctxtType == ancestor) {
    itemElem = xmlSchemaGetComponentNode((xmlSchemaBasicItemPtr)ctxtType);
    xmlSchemaPCustomErr(pctxt,XML_SCHEMAP_ST_PROPS_CORRECT_2,(xmlSchemaBasicItemPtr)ctxtType,
                        itemElem,"The definition is circular",(xmlChar *)0x0);
    pctxt_local._4_4_ = 0xbc1;
  }
  else if ((ancestor->flags & 0x10000U) == 0) {
    ancestor->flags = ancestor->flags | 0x10000;
    pctxt_local._4_4_ = xmlSchemaCheckTypeDefCircularInternal(pctxt,ctxtType,ancestor->baseType);
    ancestor->flags = ancestor->flags ^ 0x10000;
  }
  else {
    pctxt_local._4_4_ = 0;
  }
  return pctxt_local._4_4_;
}

Assistant:

static int
xmlSchemaCheckTypeDefCircularInternal(xmlSchemaParserCtxtPtr pctxt,
			   xmlSchemaTypePtr ctxtType,
			   xmlSchemaTypePtr ancestor)
{
    int ret;

    if ((ancestor == NULL) || (ancestor->type == XML_SCHEMA_TYPE_BASIC))
	return (0);

    if (ctxtType == ancestor) {
	xmlSchemaPCustomErr(pctxt,
	    XML_SCHEMAP_ST_PROPS_CORRECT_2,
	    WXS_BASIC_CAST ctxtType, WXS_ITEM_NODE(ctxtType),
	    "The definition is circular", NULL);
	return (XML_SCHEMAP_ST_PROPS_CORRECT_2);
    }
    if (ancestor->flags & XML_SCHEMAS_TYPE_MARKED) {
	/*
	* Avoid infinite recursion on circular types not yet checked.
	*/
	return (0);
    }
    ancestor->flags |= XML_SCHEMAS_TYPE_MARKED;
    ret = xmlSchemaCheckTypeDefCircularInternal(pctxt, ctxtType,
	ancestor->baseType);
    ancestor->flags ^= XML_SCHEMAS_TYPE_MARKED;
    return (ret);
}